

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawImage.cpp
# Opt level: O1

void drawImage2(Array2D<Imath_3_2::half> *gpx,Array2D<float> *zpx,int w,int h)

{
  float fVar1;
  char cVar2;
  float fVar3;
  int iVar4;
  long lVar5;
  ushort uVar6;
  long lVar7;
  uint uVar8;
  half *phVar9;
  float *pfVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  float fVar27;
  float fVar28;
  float p;
  float fVar29;
  float fVar30;
  float fVar31;
  
  if (0 < h) {
    lVar12 = gpx->_sizeY;
    phVar9 = gpx->_data;
    lVar7 = zpx->_sizeY;
    pfVar10 = zpx->_data;
    uVar11 = 0;
    do {
      if (0 < w) {
        uVar13 = 0;
        do {
          phVar9[uVar13]._h = 0;
          pfVar10[uVar13] = 3.4028235e+38;
          uVar13 = uVar13 + 1;
        } while ((uint)w != uVar13);
      }
      uVar11 = uVar11 + 1;
      pfVar10 = pfVar10 + lVar7;
      phVar9 = phVar9 + lVar12;
    } while (uVar11 != (uint)h);
  }
  fVar14 = (float)w;
  fVar29 = (float)h + -1.0;
  iVar4 = 0;
  do {
    dVar21 = (double)(((float)(iVar4 * 2) * 3.1415927) / 2000.0);
    dVar22 = sin(dVar21 * 4.0);
    dVar23 = dVar21 * 15.0;
    dVar24 = sin(dVar23);
    dVar25 = cos(dVar21 * 3.0);
    dVar26 = cos(dVar23);
    dVar21 = sin(dVar21 * 5.0);
    dVar23 = sin(dVar23);
    fVar1 = (float)dVar21 * -0.5 + 0.5 + 0.2;
    fVar31 = ((float)(dVar24 * 0.2 + dVar22) * fVar14) / 3.0 + (float)(w / 2);
    fVar3 = (float)(dVar23 * 0.3 + 0.7) * fVar14 * 0.05;
    fVar15 = floorf(fVar31 - fVar3);
    fVar20 = 0.0;
    if (0.0 <= fVar15) {
      fVar20 = fVar15;
    }
    fVar16 = ceilf(fVar31 + fVar3);
    fVar15 = fVar14 + -1.0;
    if (fVar16 <= fVar14 + -1.0) {
      fVar15 = fVar16;
    }
    if ((int)fVar20 <= (int)fVar15) {
      fVar17 = ((float)(dVar26 * 0.2 + dVar25) * (float)h) / 3.0 + (float)(h / 2);
      fVar18 = ceilf(fVar17 + fVar3);
      fVar16 = fVar29;
      if (fVar18 <= fVar29) {
        fVar16 = fVar18;
      }
      fVar19 = floorf(fVar17 - fVar3);
      fVar18 = 0.0;
      if (0.0 <= fVar19) {
        fVar18 = fVar19;
      }
      lVar12 = (long)(int)fVar20;
      do {
        if ((int)fVar18 <= (int)fVar16) {
          fVar20 = ((float)(int)lVar12 - fVar31) / fVar3;
          lVar7 = (long)(int)fVar18;
          do {
            fVar27 = ((float)(int)lVar7 - fVar17) / fVar3;
            fVar19 = fVar20 * fVar20 + fVar27 * fVar27;
            if (fVar19 < 0.0) {
              fVar19 = sqrtf(fVar19);
            }
            else {
              fVar19 = SQRT(fVar19);
            }
            if (fVar19 < 1.0) {
              fVar19 = 1.0 - fVar19 * fVar19;
              if (fVar19 < 0.0) {
                fVar19 = sqrtf(fVar19);
              }
              else {
                fVar19 = SQRT(fVar19);
              }
              lVar5 = zpx->_sizeY * lVar7;
              pfVar10 = zpx->_data;
              fVar28 = -fVar3 * fVar19 + (float)dVar21 * fVar14 + (float)(w * 3);
              if (fVar28 < pfVar10[lVar5 + lVar12]) {
                fVar19 = fVar19 * 0.7071 + fVar20 * 0.42426 + fVar27 * -0.56568;
                fVar19 = (float)(-(uint)(fVar19 < 0.0) & (uint)(fVar19 * -0.1) |
                                ~-(uint)(fVar19 < 0.0) & (uint)fVar19);
                uVar11 = 0x32;
                fVar30 = 1.0;
                fVar27 = fVar19;
                do {
                  if ((uVar11 & 1) != 0) {
                    fVar30 = fVar30 * fVar27;
                  }
                  fVar27 = fVar27 * fVar27;
                  uVar8 = (uint)uVar11;
                  uVar11 = uVar11 >> 1;
                } while (1 < uVar8);
                fVar27 = (fVar19 + fVar30 * 4.0) * fVar1 * 2.5 * fVar1;
                fVar19 = ABS(fVar27);
                uVar6 = (ushort)((uint)fVar27 >> 0x10) & 0x8000;
                if ((uint)fVar19 < 0x38800000) {
                  if ((0x33000000 < (uint)fVar19) &&
                     (uVar8 = (uint)fVar19 & 0x7fffff | 0x800000,
                     cVar2 = (char)((uint)fVar19 >> 0x17),
                     uVar6 = uVar6 | (ushort)(uVar8 >> (0x7eU - cVar2 & 0x1f)),
                     0x80000000 < uVar8 << (cVar2 + 0xa2U & 0x1f))) {
                    uVar6 = uVar6 + 1;
                  }
                }
                else if ((uint)fVar19 < 0x7f800000) {
                  if ((uint)fVar19 < 0x477ff000) {
                    uVar6 = (ushort)((int)fVar19 + 0x8000fff +
                                     (uint)(((uint)fVar19 >> 0xd & 1) != 0) >> 0xd) | uVar6;
                  }
                  else {
                    uVar6 = uVar6 | 0x7c00;
                  }
                }
                else {
                  uVar6 = uVar6 | 0x7c00;
                  if (fVar19 != INFINITY) {
                    uVar8 = (uint)fVar19 >> 0xd & 0x3ff;
                    uVar6 = uVar6 | (ushort)uVar8 | (ushort)(uVar8 == 0);
                  }
                }
                gpx->_data[gpx->_sizeY * lVar7 + lVar12]._h = uVar6;
                pfVar10[lVar5 + lVar12] = fVar28;
              }
            }
            lVar7 = lVar7 + 1;
          } while ((int)fVar16 + 1 != (int)lVar7);
        }
        lVar12 = lVar12 + 1;
      } while ((int)fVar15 + 1 != (int)lVar12);
    }
    iVar4 = iVar4 + 1;
  } while (iVar4 != 2000);
  return;
}

Assistant:

void
drawImage2 (Array2D<half>& gpx, Array2D<float>& zpx, int w, int h)
{
    for (int y = 0; y < h; ++y)
    {
        for (int x = 0; x < w; ++x)
        {
            gpx[y][x] = 0;
            zpx[y][x] = FLT_MAX;
        }
    }

    int n = 2000;

    for (int i = 0; i < n; ++i)
    {
        float t  = (i * 2.0 * M_PI) / n;
        float xp = sin (t * 4.0) + 0.2 * sin (t * 15.0);
        float yp = cos (t * 3.0) + 0.2 * cos (t * 15.0);
        float zp = sin (t * 5.0);
        float rd = 0.7 + 0.3 * sin (t * 15.0);
        float gn = 0.5 - 0.5 * zp + 0.2;

        zsp (
            gpx,
            zpx,
            w,
            h,
            xp * w / 3 + w / 2,
            yp * h / 3 + h / 2,
            zp * w + 3 * w,
            w * rd * 0.05,
            2.5 * gn * gn);
    }
}